

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::CodeGeneratorResponse_File
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  string *default_value;
  CodeGeneratorResponse_File *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_fffffffffffffed8;
  InternalMetadataWithArena *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffef0;
  ArenaStringPtr *in_stack_fffffffffffffef8;
  ArenaStringPtr in_stack_ffffffffffffff00;
  
  Message::Message((Message *)in_stack_fffffffffffffee0);
  *in_RDI = &PTR__CodeGeneratorResponse_File_00895b88;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  *(uint32 *)(in_RDI + 2) = (in_RSI->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize((CachedSize *)0x4b3434);
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              (in_stack_fffffffffffffee0,(UnknownFieldSet *)in_stack_fffffffffffffed8);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 3),psVar2);
  bVar1 = _internal_has_name(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    internal::ArenaStringPtr::AssignWithDefault
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_ffffffffffffff00);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 4),psVar2);
  bVar1 = _internal_has_insertion_point(in_RSI);
  if (bVar1) {
    in_stack_ffffffffffffff00.ptr_ = (string *)(in_RDI + 4);
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    internal::ArenaStringPtr::AssignWithDefault
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_ffffffffffffff00);
  }
  psVar2 = (string *)(in_RDI + 5);
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)psVar2,default_value);
  bVar1 = _internal_has_content(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    internal::ArenaStringPtr::AssignWithDefault
              ((ArenaStringPtr *)default_value,psVar2,in_stack_ffffffffffffff00);
  }
  return;
}

Assistant:

CodeGeneratorResponse_File::CodeGeneratorResponse_File(const CodeGeneratorResponse_File& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  insertion_point_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_insertion_point()) {
    insertion_point_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.insertion_point_);
  }
  content_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_content()) {
    content_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.content_);
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.compiler.CodeGeneratorResponse.File)
}